

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void nni_http_conn_reset(nng_http *conn)

{
  char *s;
  
  nni_http_req_reset(&conn->req);
  nni_http_res_reset(&conn->res);
  builtin_strncpy(conn->meth,"GET",4);
  if (conn->host[0] != '\0') {
    nni_http_set_host(conn,conn->host);
  }
  s = conn->uri;
  if (s != conn->ubuf && s != (char *)0x0) {
    nni_strfree(s);
  }
  conn->uri = (char *)0x0;
  nni_http_set_version(conn,"HTTP/1.1");
  nni_http_set_status(conn,0,(char *)0x0);
  return;
}

Assistant:

void
nni_http_conn_reset(nng_http *conn)
{
	nni_http_req_reset(&conn->req);
	nni_http_res_reset(&conn->res);
	(void) snprintf(conn->meth, sizeof(conn->meth), "GET");
	if (strlen(conn->host)) {
		nni_http_set_host(conn, conn->host);
	}
	if (conn->uri != NULL && conn->uri != conn->ubuf) {
		nni_strfree(conn->uri);
	}
	conn->uri = NULL;
	nni_http_set_version(conn, NNG_HTTP_VERSION_1_1);
	nni_http_set_status(conn, 0, NULL);
}